

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Print
          (Printer *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables,char *text)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *this_00;
  size_t sVar1;
  size_t sVar2;
  int size;
  size_t sVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  const_iterator cVar6;
  char *__s;
  int iVar7;
  long lVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_bool>
  pVar9;
  LogFinisher local_ad;
  uint local_ac;
  Printer *local_a8;
  string varname;
  LogMessage local_68;
  
  sVar3 = strlen(text);
  this_00 = &this->substitutions_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::clear(&this_00->_M_t);
  local_ac = ~(uint)text;
  iVar7 = 0;
LAB_0031d73c:
  do {
    lVar8 = 0;
    while( true ) {
      size = (int)lVar8;
      if ((int)sVar3 <= iVar7 + size) {
        WriteRaw(this,text + iVar7,(int)sVar3 - iVar7);
        return;
      }
      if (text[lVar8 + iVar7] == '\n') {
        lVar8 = (long)iVar7;
        iVar7 = iVar7 + size + 1;
        WriteRaw(this,text + lVar8,size + 1);
        this->at_start_of_line_ = true;
        goto LAB_0031d73c;
      }
      if (text[lVar8 + iVar7] == this->variable_delimiter_) break;
      lVar8 = lVar8 + 1;
    }
    WriteRaw(this,text + iVar7,size);
    __s = text + (iVar7 + size + 1);
    local_a8 = this;
    pcVar4 = strchr(__s,(int)this->variable_delimiter_);
    if (pcVar4 == (char *)0x0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/printer.cc"
                 ,0x88);
      pLVar5 = internal::LogMessage::operator<<(&local_68," Unclosed variable name.");
      internal::LogFinisher::operator=((LogFinisher *)&varname,pLVar5);
      internal::LogMessage::~LogMessage(&local_68);
      pcVar4 = __s;
    }
    varname._M_dataplus._M_p = (pointer)&varname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&varname,__s,__s + (int)(((local_ac - iVar7) + (int)pcVar4) - size));
    this = local_a8;
    if (varname._M_string_length == 0) {
      WriteRaw(local_a8,&local_a8->variable_delimiter_,1);
    }
    else {
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&variables->_M_t,&varname);
      if ((_Rb_tree_header *)cVar6._M_node == &(variables->_M_t)._M_impl.super__Rb_tree_header) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/printer.cc"
                   ,0x95);
        pLVar5 = internal::LogMessage::operator<<(&local_68," Undefined variable: ");
        pLVar5 = internal::LogMessage::operator<<(pLVar5,&varname);
        internal::LogFinisher::operator=(&local_ad,pLVar5);
        internal::LogMessage::~LogMessage(&local_68);
      }
      else {
        sVar1 = this->offset_;
        WriteRaw(this,*(char **)(cVar6._M_node + 2),*(int *)&cVar6._M_node[2]._M_parent);
        sVar2 = this->offset_;
        std::__cxx11::string::string((string *)&local_68,(string *)&varname);
        local_68.message_._M_string_length = sVar1;
        local_68.message_.field_2._M_allocated_capacity = sVar2;
        pVar9 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                ::
                _M_emplace_unique<std::pair<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                            *)this_00,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>
                            *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        this = local_a8;
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          *(undefined8 *)(pVar9.first._M_node._M_node + 2) = 1;
          pVar9.first._M_node._M_node[2]._M_parent = (_Base_ptr)0x0;
        }
      }
    }
    iVar7 = ((int)pcVar4 - (uint)text) + 1;
    std::__cxx11::string::~string((string *)&varname);
  } while( true );
}

Assistant:

void Printer::Print(const std::map<string, string>& variables,
                    const char* text) {
  int size = strlen(text);
  int pos = 0;  // The number of bytes we've written so far.
  substitutions_.clear();

  for (int i = 0; i < size; i++) {
    if (text[i] == '\n') {
      // Saw newline.  If there is more text, we may need to insert an indent
      // here.  So, write what we have so far, including the '\n'.
      WriteRaw(text + pos, i - pos + 1);
      pos = i + 1;

      // Setting this true will cause the next WriteRaw() to insert an indent
      // first.
      at_start_of_line_ = true;

    } else if (text[i] == variable_delimiter_) {
      // Saw the start of a variable name.

      // Write what we have so far.
      WriteRaw(text + pos, i - pos);
      pos = i + 1;

      // Find closing delimiter.
      const char* end = strchr(text + pos, variable_delimiter_);
      if (end == NULL) {
        GOOGLE_LOG(DFATAL) << " Unclosed variable name.";
        end = text + pos;
      }
      int endpos = end - text;

      string varname(text + pos, endpos - pos);
      if (varname.empty()) {
        // Two delimiters in a row reduce to a literal delimiter character.
        WriteRaw(&variable_delimiter_, 1);
      } else {
        // Replace with the variable's value.
        std::map<string, string>::const_iterator iter = variables.find(varname);
        if (iter == variables.end()) {
          GOOGLE_LOG(DFATAL) << " Undefined variable: " << varname;
        } else {
          size_t begin = offset_;
          WriteRaw(iter->second.data(), iter->second.size());
          std::pair<std::map<string, std::pair<size_t, size_t> >::iterator,
                    bool>
              inserted = substitutions_.insert(
                  std::make_pair(varname, std::make_pair(begin, offset_)));
          if (!inserted.second) {
            // This variable was used multiple times.  Make its span have
            // negative length so we can detect it if it gets used in an
            // annotation.
            inserted.first->second = std::make_pair(1, 0);
          }
        }
      }

      // Advance past this variable.
      i = endpos;
      pos = endpos + 1;
    }
  }

  // Write the rest.
  WriteRaw(text + pos, size - pos);
}